

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

int CRYPTO_pkcs7_unpad(uint *unpadded_buflen_p,uchar *buf,uint blocksize)

{
  byte bVar1;
  ulong uVar2;
  uchar *puVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  
  uVar6 = 0;
  if (0xffffff00 < blocksize - 0x100) {
    uVar2 = (ulong)blocksize;
    bVar1 = buf[uVar2 - 1];
    puVar3 = buf + -1;
    uVar6 = 0;
    bVar5 = 0;
    for (uVar4 = 0; uVar2 != uVar4; uVar4 = uVar4 + 1) {
      uVar6 = uVar6 | ((uint)uVar4 ^ (uint)bVar1) - 1 >> 0x18;
      bVar5 = bVar5 | ~(byte)uVar6 & (puVar3[uVar2] ^ bVar1);
      puVar3 = puVar3 + -1;
    }
    *unpadded_buflen_p = blocksize - bVar1;
    uVar6 = (uint)(bVar1 <= blocksize && bVar5 == 0);
  }
  return uVar6;
}

Assistant:

int CRYPTO_pkcs7_unpad(unsigned int *unpadded_buflen_p, unsigned char *buf, unsigned int blocksize)
{
    const unsigned char       *tail;
    unsigned char              mask = 0U;
    unsigned char              c;
    unsigned char              invalid = 0U;
    unsigned int               i;
    unsigned char              pad;

    if (blocksize <= 0U || blocksize >= 256U)
        return GML_ERROR;

    tail = &buf[blocksize - 1U];
    pad = *tail;

    for (i = 0U; i < blocksize; i++) {
        c = *(tail - i);
        mask |= (unsigned char) (((i ^ (unsigned int) pad) - 1U) >> ((sizeof(unsigned int) - 1) * 8));
        invalid |= (c ^ pad) & (~mask);
    }
    *unpadded_buflen_p = blocksize - (unsigned int) pad;

    return (int)(invalid == 0U && pad <= blocksize);
}